

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::Implicit_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::Implicit_const&> *this,Implicit *rhs)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *prVar6;
  ostringstream os;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  result *local_380;
  long local_378;
  result local_370;
  long *local_340;
  long local_338;
  long local_330 [2];
  long local_320 [3];
  uint auStack_308 [22];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = *(int *)this;
  iVar2 = rhs->x;
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"==","");
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  puVar1 = (uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  iVar4 = *(int *)this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Implicit:",9);
  std::ostream::operator<<((ostream *)local_320,iVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_340,local_338);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_3a0,local_398);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  puVar1 = (uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  iVar4 = rhs->x;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Implicit:",9);
  std::ostream::operator<<((ostream *)local_320,iVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,(char *)local_370.decomposition._M_string_length,
             local_370.decomposition.field_2._M_allocated_capacity);
  if ((char *)local_370.decomposition._M_string_length !=
      (char *)((long)&local_370.decomposition.field_2 + 8)) {
    operator_delete((void *)local_370.decomposition._M_string_length,
                    local_370.decomposition.field_2._8_8_ + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  __return_storage_ptr__->passed = iVar3 == iVar2;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_380,
             &local_380->passed + local_378);
  prVar6 = &local_370;
  if (local_380 != prVar6) {
    operator_delete(local_380,local_370._0_8_ + 1);
    prVar6 = extraout_RAX;
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
    prVar6 = extraout_RAX_00;
  }
  return prVar6;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }